

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_emu_d3d56.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdEmuD3D56TlvUv::~MthdEmuD3D56TlvUv(MthdEmuD3D56TlvUv *this)

{
  MthdEmuD3D56TlvUv *this_local;
  
  ~MthdEmuD3D56TlvUv(this);
  operator_delete(this);
  return;
}

Assistant:

void adjust_orig_mthd() override {
		if (fin) {
			insrt(orig.notify, 0, 1, 0);
			adjust_orig_icmd(&orig);
		}
		if (cls == 0x48 && fin) {
			// XXX: test me
			exp.valid[0] = 0;
			exp.valid[1] = 0;
		}
		if (rnd() & 1) {
			insrt(val, 0, 23, 0);
			val ^= 1 << (rnd() & 0x1f);
		}
	}